

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindAllExtensionNumbers
          (MergedDescriptorDatabase *this,StringViewArg extendee_type,
          vector<int,_std::allocator<int>_> *output)

{
  pointer piVar1;
  vector<int,_std::allocator<int>_> *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  reference piVar5;
  pointer ppDVar6;
  iterator __begin4;
  pointer piVar7;
  iterator iVar8;
  int r_1;
  vector<int,_std::allocator<int>_> results;
  btree_set<int,_std::less<int>,_std::allocator<int>_> merged_results;
  int r;
  int local_ac;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> *local_88;
  StringViewArg local_80;
  pointer local_78;
  btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  local_70;
  iterator local_58;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>,_bool>
  local_48;
  
  local_70.root_ =
       (node_type *)
       absl::lts_20250127::container_internal::
       btree<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
       ::EmptyNode()::empty_node;
  local_70.rightmost_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<int>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<int>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
             ::EmptyNode()::empty_node;
  local_70.size_ = 0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = (this->sources_).
             super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = false;
  local_88 = output;
  local_80 = extendee_type;
  for (ppDVar6 = (this->sources_).
                 super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppDVar6 != local_78;
      ppDVar6 = ppDVar6 + 1) {
    iVar4 = (*(*ppDVar6)->_vptr_DescriptorDatabase[5])(*ppDVar6,local_80,&local_a8);
    piVar1 = local_a8._M_impl.super__Vector_impl_data._M_finish;
    piVar7 = local_a8._M_impl.super__Vector_impl_data._M_start;
    if ((char)iVar4 != '\0') {
      for (; piVar7 != piVar1; piVar7 = piVar7 + 1) {
        local_58.node_ =
             (btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
              *)CONCAT44(local_58.node_._4_4_,*piVar7);
        absl::lts_20250127::container_internal::
        btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
        ::insert(&local_48,
                 (btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                  *)&local_70,(value_type *)&local_58);
      }
      bVar2 = true;
    }
    if (local_a8._M_impl.super__Vector_impl_data._M_finish !=
        local_a8._M_impl.super__Vector_impl_data._M_start) {
      local_a8._M_impl.super__Vector_impl_data._M_finish =
           local_a8._M_impl.super__Vector_impl_data._M_start;
    }
  }
  iVar8 = absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          ::begin(&local_70);
  local_48.first.node_ =
       (btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
        *)iVar8.node_;
  local_48.first.position_ = iVar8.position_;
  iVar8 = absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          ::end(&local_70);
  this_00 = local_88;
  local_58.node_ = iVar8.node_;
  local_58.position_ = iVar8.position_;
  while( true ) {
    bVar3 = absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
            ::operator!=(&local_48.first,&local_58);
    if (!bVar3) break;
    piVar5 = absl::lts_20250127::container_internal::
             btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
             ::operator*(&local_48.first);
    local_ac = *piVar5;
    std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_ac);
    absl::lts_20250127::container_internal::
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
    ::increment(&local_48.first);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
  absl::lts_20250127::container_internal::
  btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  ::~btree(&local_70);
  return bVar2;
}

Assistant:

bool MergedDescriptorDatabase::FindAllExtensionNumbers(
    StringViewArg extendee_type, std::vector<int>* output) {
  // NOLINTNEXTLINE(google3-runtime-rename-unnecessary-ordering)
  absl::btree_set<int> merged_results;
  std::vector<int> results;
  bool success = false;
  for (DescriptorDatabase* source : sources_) {
    if (source->FindAllExtensionNumbers(extendee_type, &results)) {
      for (int r : results) merged_results.insert(r);
      success = true;
    }
    results.clear();
  }
  for (int r : merged_results) output->push_back(r);
  return success;
}